

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

ExprTree * __thiscall PcodeCompile::createOp(PcodeCompile *this,OpCode opc,ExprTree *vn)

{
  OpTpl *this_00;
  AddrSpace *this_01;
  OpTpl *local_30;
  OpTpl *op;
  VarnodeTpl *outvn;
  ExprTree *vn_local;
  PcodeCompile *pPStack_10;
  OpCode opc_local;
  PcodeCompile *this_local;
  
  outvn = (VarnodeTpl *)vn;
  vn_local._4_4_ = opc;
  pPStack_10 = this;
  op = (OpTpl *)buildTemporary(this);
  this_00 = (OpTpl *)operator_new(0x28);
  OpTpl::OpTpl(this_00,vn_local._4_4_);
  local_30 = this_00;
  OpTpl::addInput(this_00,(VarnodeTpl *)(outvn->space).value.spaceid);
  OpTpl::setOutput(local_30,(VarnodeTpl *)op);
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back
            (*(vector<OpTpl_*,_std::allocator<OpTpl_*>_> **)&outvn->space,&local_30);
  this_01 = (AddrSpace *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl((VarnodeTpl *)this_01,(VarnodeTpl *)op);
  (outvn->space).value.spaceid = this_01;
  return (ExprTree *)outvn;
}

Assistant:

ExprTree *PcodeCompile::createOp(OpCode opc,ExprTree *vn)

{				// Create new expression with output -outvn-
				// built by performing -opc- on input vn.
				// Free input expression
  VarnodeTpl *outvn = buildTemporary();
  OpTpl *op = new OpTpl(opc);
  op->addInput(vn->outvn);
  op->setOutput(outvn);
  vn->ops->push_back(op);
  vn->outvn = new VarnodeTpl(*outvn);
  return vn;
}